

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEdit::QPlainTextEdit(QPlainTextEdit *this,QPlainTextEditPrivate *dd,QWidget *parent)

{
  QPlainTextEditPrivate *this_00;
  QAbstractScrollAreaPrivate *in_RDX;
  QAbstractScrollArea *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QPlainTextEditPrivate *d;
  QWidget *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::QAbstractScrollArea(in_RSI,in_RDX,in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_metaObject_00d1d3a8;
  in_RDI[2] = &PTR__QPlainTextEdit_00d1d5a8;
  this_00 = d_func((QPlainTextEdit *)0x6c3d31);
  QString::QString((QString *)0x6c3d4f);
  QPlainTextEditPrivate::init(this_00,local_20);
  QString::~QString((QString *)0x6c3d68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPlainTextEdit::QPlainTextEdit(QPlainTextEditPrivate &dd, QWidget *parent)
    : QAbstractScrollArea(dd, parent)
{
    Q_D(QPlainTextEdit);
    d->init();
}